

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<NoCopy,_kj::_::PromiseAndFulfillerAdapter<NoCopy>_>::reject
          (AdapterPromiseNode<NoCopy,_kj::_::PromiseAndFulfillerAdapter<NoCopy>_> *this,
          Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<NoCopy> local_1b8;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<NoCopy,_kj::_::PromiseAndFulfillerAdapter<NoCopy>_> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<NoCopy>::ExceptionOr(&local_1b8,false,exception_00);
    ExceptionOr<NoCopy>::operator=(&this->result,&local_1b8);
    ExceptionOr<NoCopy>::~ExceptionOr(&local_1b8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }